

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  XmlWriter *pXVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  OfType OVar3;
  pointer pMVar4;
  pointer pMVar5;
  pointer pcVar6;
  string *psVar7;
  int iVar8;
  XmlWriter *pXVar9;
  XmlWriter *this_00;
  _Alloc_hider _Var10;
  string *text;
  ScopedElement scoped;
  ScopedElement scoped_2;
  ScopedElement scoped_5;
  string local_148;
  size_t local_128;
  undefined1 local_120 [32];
  pointer local_100;
  string local_f8;
  XmlReporter *local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d8 = this;
  if ((assertionStats->assertionResult).m_resultData.resultType != Ok) {
    pMVar4 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar5 = (assertionStats->infoMessages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pMVar4 != pMVar5) {
      paVar2 = &local_148.field_2;
      pXVar1 = &this->m_xml;
      text = &pMVar4->message;
      do {
        iVar8 = *(int *)((long)&text[-1].field_2 + 8);
        if (iVar8 == 2) {
          local_148._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Warning","");
          local_120._0_8_ = pXVar1;
          XmlWriter::startElement(pXVar1,&local_148);
          XmlWriter::writeText((XmlWriter *)local_120._0_8_,text,true);
LAB_0013ba21:
          XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_120);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
        }
        else if (iVar8 == 1) {
          local_148._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Info","");
          local_120._0_8_ = pXVar1;
          XmlWriter::startElement(pXVar1,&local_148);
          XmlWriter::writeText((XmlWriter *)local_120._0_8_,text,true);
          goto LAB_0013ba21;
        }
        psVar7 = text + 1;
        text = (string *)((long)&text[3].field_2 + 8);
      } while ((pointer)&psVar7->_M_string_length != pMVar5);
    }
  }
  iVar8 = (*(((local_d8->super_StreamingReporterBase).m_config.m_p)->super_IShared).
            super_NonCopyable._vptr_NonCopyable[7])();
  if (((char)iVar8 == '\0') &&
     (((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok)) {
    return true;
  }
  if ((assertionStats->assertionResult).m_info.capturedExpression._M_string_length != 0) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Expression","");
    pXVar1 = &local_d8->m_xml;
    pXVar9 = XmlWriter::startElement(pXVar1,&local_f8);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"success","");
    pXVar9 = XmlWriter::writeAttribute
                       (pXVar9,&local_90,
                        ((assertionStats->assertionResult).m_resultData.resultType & FailureBit) ==
                        Ok);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"type","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar6 = (assertionStats->assertionResult).m_info.macroName._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar6,
               pcVar6 + (assertionStats->assertionResult).m_info.macroName._M_string_length);
    pXVar9 = XmlWriter::writeAttribute(pXVar9,&local_d0,&local_b0);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"filename","");
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    pcVar6 = (assertionStats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,pcVar6,
               pcVar6 + (assertionStats->assertionResult).m_info.lineInfo.file._M_string_length);
    local_128 = (assertionStats->assertionResult).m_info.lineInfo.line;
    this_00 = XmlWriter::writeAttribute(pXVar9,&local_70,&local_148);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"line","");
    pXVar9 = (XmlWriter *)(local_120 + 0x10);
    pcVar6 = (assertionStats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
    local_120._0_8_ = pXVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_120,pcVar6,
               pcVar6 + (assertionStats->assertionResult).m_info.lineInfo.file._M_string_length);
    local_100 = (pointer)(assertionStats->assertionResult).m_info.lineInfo.line;
    XmlWriter::writeAttribute<unsigned_long>(this_00,&local_50,(unsigned_long *)&local_100);
    paVar2 = &local_148.field_2;
    if ((XmlWriter *)local_120._0_8_ != pXVar9) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_148._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Original","");
    local_f8._M_dataplus._M_p = &pXVar1->m_tagIsOpen;
    XmlWriter::startElement(pXVar1,&local_148);
    AssertionResult::getExpression_abi_cxx11_((string *)local_120,&assertionStats->assertionResult);
    XmlWriter::writeText((XmlWriter *)local_f8._M_dataplus._M_p,(string *)local_120,true);
    if ((XmlWriter *)local_120._0_8_ != pXVar9) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    local_148._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Expanded","");
    local_f8._M_dataplus._M_p = &pXVar1->m_tagIsOpen;
    XmlWriter::startElement(pXVar1,&local_148);
    pcVar6 = (assertionStats->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p
    ;
    local_120._0_8_ = pXVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_120,pcVar6,
               pcVar6 + (assertionStats->assertionResult).m_resultData.reconstructedExpression.
                        _M_string_length);
    XmlWriter::writeText((XmlWriter *)local_f8._M_dataplus._M_p,(string *)local_120,true);
    if ((XmlWriter *)local_120._0_8_ != pXVar9) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  OVar3 = (assertionStats->assertionResult).m_resultData.resultType;
  if (OVar3 < ThrewException) {
    if (OVar3 == Info) {
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Info","");
      local_f8._M_dataplus._M_p = &(local_d8->m_xml).m_tagIsOpen;
      XmlWriter::startElement((XmlWriter *)local_f8._M_dataplus._M_p,&local_148);
      local_120._0_8_ = local_120 + 0x10;
      pcVar6 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,pcVar6,
                 pcVar6 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_f8._M_dataplus._M_p,(string *)local_120,true);
    }
    else {
      if (OVar3 != ExplicitFailure) goto LAB_0013c33f;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Failure","");
      local_f8._M_dataplus._M_p = &(local_d8->m_xml).m_tagIsOpen;
      XmlWriter::startElement((XmlWriter *)local_f8._M_dataplus._M_p,&local_148);
      local_120._0_8_ = local_120 + 0x10;
      pcVar6 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,pcVar6,
                 pcVar6 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_f8._M_dataplus._M_p,(string *)local_120,true);
    }
    if ((XmlWriter *)local_120._0_8_ != (XmlWriter *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_f8);
    local_f8.field_2._M_allocated_capacity = local_148.field_2._M_allocated_capacity;
    _Var10._M_p = local_148._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == &local_148.field_2) goto LAB_0013c33f;
  }
  else {
    if (OVar3 == FatalErrorCondition) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"FatalErrorCondition","");
      local_70._M_dataplus._M_p = &(local_d8->m_xml).m_tagIsOpen;
      XmlWriter::startElement((XmlWriter *)local_70._M_dataplus._M_p,&local_f8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"filename","");
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pcVar6 = (assertionStats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,pcVar6,
                 pcVar6 + (assertionStats->assertionResult).m_info.lineInfo.file._M_string_length);
      local_128 = (assertionStats->assertionResult).m_info.lineInfo.line;
      XmlWriter::writeAttribute((XmlWriter *)local_70._M_dataplus._M_p,&local_90,&local_148);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"line","");
      local_120._0_8_ = local_120 + 0x10;
      pcVar6 = (assertionStats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,pcVar6,
                 pcVar6 + (assertionStats->assertionResult).m_info.lineInfo.file._M_string_length);
      local_100 = (pointer)(assertionStats->assertionResult).m_info.lineInfo.line;
      XmlWriter::writeAttribute<unsigned_long>
                ((XmlWriter *)local_70._M_dataplus._M_p,&local_d0,(unsigned_long *)&local_100);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar6 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar6,
                 pcVar6 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_70._M_dataplus._M_p,&local_b0,true);
    }
    else {
      if (OVar3 != ThrewException) goto LAB_0013c33f;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Exception","");
      local_70._M_dataplus._M_p = &(local_d8->m_xml).m_tagIsOpen;
      XmlWriter::startElement((XmlWriter *)local_70._M_dataplus._M_p,&local_f8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"filename","");
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pcVar6 = (assertionStats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,pcVar6,
                 pcVar6 + (assertionStats->assertionResult).m_info.lineInfo.file._M_string_length);
      local_128 = (assertionStats->assertionResult).m_info.lineInfo.line;
      XmlWriter::writeAttribute((XmlWriter *)local_70._M_dataplus._M_p,&local_90,&local_148);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"line","");
      local_120._0_8_ = local_120 + 0x10;
      pcVar6 = (assertionStats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,pcVar6,
                 pcVar6 + (assertionStats->assertionResult).m_info.lineInfo.file._M_string_length);
      local_100 = (pointer)(assertionStats->assertionResult).m_info.lineInfo.line;
      XmlWriter::writeAttribute<unsigned_long>
                ((XmlWriter *)local_70._M_dataplus._M_p,&local_d0,(unsigned_long *)&local_100);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar6 = (assertionStats->assertionResult).m_resultData.message._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar6,
                 pcVar6 + (assertionStats->assertionResult).m_resultData.message._M_string_length);
      XmlWriter::writeText((XmlWriter *)local_70._M_dataplus._M_p,&local_b0,true);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((XmlWriter *)local_120._0_8_ != (XmlWriter *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_70);
    _Var10._M_p = local_f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) goto LAB_0013c33f;
  }
  operator_delete(_Var10._M_p,local_f8.field_2._M_allocated_capacity + 1);
LAB_0013c33f:
  if ((assertionStats->assertionResult).m_info.capturedExpression._M_string_length != 0) {
    XmlWriter::endElement(&local_d8->m_xml);
  }
  return true;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& assertionStats ) CATCH_OVERRIDE {
            const AssertionResult& assertionResult = assertionStats.assertionResult;

            // Print any info messages in <Info> tags.
            if( assertionStats.assertionResult.getResultType() != ResultWas::Ok ) {
                for( std::vector<MessageInfo>::const_iterator it = assertionStats.infoMessages.begin(), itEnd = assertionStats.infoMessages.end();
                        it != itEnd;
                        ++it ) {
                    if( it->type == ResultWas::Info ) {
                        m_xml.scopedElement( "Info" )
                            .writeText( it->message );
                    } else if ( it->type == ResultWas::Warning ) {
                        m_xml.scopedElement( "Warning" )
                            .writeText( it->message );
                    }
                }
            }

            // Drop out if result was successful but we're not printing them.
            if( !m_config->includeSuccessfulResults() && isOk(assertionResult.getResultType()) )
                return true;

            // Print the expression if there is one.
            if( assertionResult.hasExpression() ) {
                m_xml.startElement( "Expression" )
                    .writeAttribute( "success", assertionResult.succeeded() )
					.writeAttribute( "type", assertionResult.getTestMacroName() )
                    .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                    .writeAttribute( "line", assertionResult.getSourceInfo().line );

                m_xml.scopedElement( "Original" )
                    .writeText( assertionResult.getExpression() );
                m_xml.scopedElement( "Expanded" )
                    .writeText( assertionResult.getExpandedExpression() );
            }

            // And... Print a result applicable to each result type.
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    m_xml.scopedElement( "Exception" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::FatalErrorCondition:
                    m_xml.scopedElement( "FatalErrorCondition" )
                        .writeAttribute( "filename", assertionResult.getSourceInfo().file )
                        .writeAttribute( "line", assertionResult.getSourceInfo().line )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Info:
                    m_xml.scopedElement( "Info" )
                        .writeText( assertionResult.getMessage() );
                    break;
                case ResultWas::Warning:
                    // Warning will already have been written
                    break;
                case ResultWas::ExplicitFailure:
                    m_xml.scopedElement( "Failure" )
                        .writeText( assertionResult.getMessage() );
                    break;
                default:
                    break;
            }

            if( assertionResult.hasExpression() )
                m_xml.endElement();

            return true;
        }